

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestStart(StreamingListener *this,TestInfo *test_info)

{
  String local_40;
  string local_30;
  
  String::Format((char *)&local_40,"event=TestStart&name=%s\n",(test_info->name_)._M_dataplus._M_p);
  String::operator_cast_to_string(&local_30,&local_40);
  Send(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  String::~String(&local_40);
  return;
}

Assistant:

void OnTestStart(const TestInfo& test_info) {
    Send(String::Format("event=TestStart&name=%s\n", test_info.name()));
  }